

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue)

{
  int iVar1;
  long lVar2;
  Expr **ppEVar3;
  long lVar4;
  
  iVar1 = pConst->nConst;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)pConst->apExpr + lVar4);
      if ((*(int *)(lVar2 + 0x2c) == pColumn->iTable) &&
         (*(short *)(lVar2 + 0x30) == pColumn->iColumn)) {
        return;
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar1 << 4 != lVar4);
  }
  pConst->nConst = iVar1 + 1;
  ppEVar3 = (Expr **)sqlite3DbReallocOrFree
                               (pConst->pParse->db,pConst->apExpr,(long)(iVar1 * 2 + 2) << 3);
  pConst->apExpr = ppEVar3;
  if (ppEVar3 == (Expr **)0x0) {
    pConst->nConst = 0;
  }
  else {
    if ((pValue->flags & 8) != 0) {
      pValue = pValue->pLeft;
    }
    iVar1 = pConst->nConst;
    ppEVar3[(long)iVar1 * 2 + -2] = pColumn;
    pConst->apExpr[(long)iVar1 * 2 + -1] = pValue;
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,      /* The WhereConst into which we are inserting */
  Expr *pColumn,           /* The COLUMN part of the constraint */
  Expr *pValue             /* The VALUE part of the constraint */
){
  int i;
  assert( pColumn->op==TK_COLUMN );

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pExpr = pConst->apExpr[i*2];
    assert( pExpr->op==TK_COLUMN );
    if( pExpr->iTable==pColumn->iTable
     && pExpr->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    if( ExprHasProperty(pValue, EP_FixedCol) ) pValue = pValue->pLeft;
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}